

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_config.cpp
# Opt level: O2

void check_locale(char **names)

{
  char *__locale;
  ostream *poVar1;
  char *pcVar2;
  char *pcVar3;
  locale l;
  
  poVar1 = std::operator<<((ostream *)&std::cout,"  ");
  *(undefined8 *)(poVar1 + *(long *)(*(long *)poVar1 + -0x18) + 0x10) = 0x20;
  poVar1 = std::operator<<(poVar1,"locale");
  *(undefined8 *)(poVar1 + *(long *)(*(long *)poVar1 + -0x18) + 0x10) = 4;
  poVar1 = std::operator<<(poVar1,"C");
  *(undefined8 *)(poVar1 + *(long *)(*(long *)poVar1 + -0x18) + 0x10) = 4;
  poVar1 = std::operator<<(poVar1,"C++");
  std::endl<char,std::char_traits<char>>(poVar1);
  for (; __locale = *names, __locale != (char *)0x0; names = names + 1) {
    poVar1 = std::operator<<((ostream *)&std::cout,"  ");
    *(undefined8 *)(poVar1 + *(long *)(*(long *)poVar1 + -0x18) + 0x10) = 0x20;
    poVar1 = std::operator<<(poVar1,__locale);
    *(undefined8 *)(poVar1 + *(long *)(*(long *)poVar1 + -0x18) + 0x10) = 4;
    pcVar2 = setlocale(6,__locale);
    pcVar3 = "Yes";
    if (pcVar2 == (char *)0x0) {
      pcVar3 = "No";
    }
    std::operator<<((ostream *)&std::cout,pcVar3);
    *(undefined8 *)(std::wfstream::~wfstream + *(long *)(std::cout + -0x18)) = 4;
    std::locale::locale(&l,__locale);
    std::operator<<((ostream *)&std::cout,"Yes");
    std::locale::~locale(&l);
    std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
  }
  return;
}

Assistant:

void check_locale(char const **names)
{
    std::cout << "  " << std::setw(32) << "locale" << std::setw(4) << "C" << std::setw(4) << "C++" << std::endl;
    while(*names) {
        char const *name = *names;
        std::cout << "  " << std::setw(32) << name << std::setw(4);
        if(setlocale(LC_ALL,name)!=0)
            std::cout << "Yes";
        else
            std::cout << "No";
        std::cout << std::setw(4);
        try {
            std::locale l(name);
            std::cout << "Yes";
        }
        catch(std::exception const &) {
            std::cout << "No";
        }
        std::cout << std::endl;
        names++;
    }
}